

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O0

void __thiscall Unowned_Assign_Test::TestBody(Unowned_Assign_Test *this)

{
  int *piVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  int *local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_3;
  unowned_ptr<int> b;
  Message local_b0;
  void *local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_88;
  Message local_80;
  void *local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  Message local_50 [3];
  int *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  unowned_ptr<int> a;
  int i;
  Unowned_Assign_Test *this_local;
  
  a._p._4_4_ = 5;
  piVar1 = (int *)((long)&a._p + 4);
  cgs::unowned_ptr<int>::unowned_ptr((unowned_ptr<int> *)&gtest_ar.message_,piVar1);
  local_38 = piVar1;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,int*>
            ((EqHelper<false> *)local_30,"a","&i",(unowned_ptr<int> *)&gtest_ar.message_,&local_38);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  cgs::unowned_ptr<int>::unowned_ptr((unowned_ptr<int> *)&gtest_ar_1.message_,(int *)0x0);
  gtest_ar.message_ = gtest_ar_1.message_;
  local_78 = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((EqHelper<false> *)local_70,"a","nullptr",(unowned_ptr<int> *)&gtest_ar.message_,
             &local_78);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar2) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cgs::unowned_ptr<int>::unowned_ptr((unowned_ptr<int> *)&gtest_ar_2.message_);
  gtest_ar.message_ = gtest_ar_2.message_;
  local_a8 = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((EqHelper<false> *)local_a0,"a","nullptr",(unowned_ptr<int> *)&gtest_ar.message_,
             &local_a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  piVar1 = (int *)((long)&a._p + 4);
  cgs::unowned_ptr<int>::unowned_ptr((unowned_ptr<int> *)&gtest_ar_3.message_,piVar1);
  gtest_ar.message_ = gtest_ar_3.message_;
  local_d8 = piVar1;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,int*>
            ((EqHelper<false> *)local_d0,"a","&i",(unowned_ptr<int> *)&gtest_ar.message_,&local_d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((EqHelper<false> *)local_f8,"a","b",(unowned_ptr<int> *)&gtest_ar.message_,
             (unowned_ptr<int> *)&gtest_ar_3.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  return;
}

Assistant:

TEST(Unowned, Assign)
{
    int i = 5;
    unowned_ptr<int> a { &i };
    EXPECT_EQ(a, &i);
    a = nullptr;
    EXPECT_EQ(a, nullptr);
    a = {};
    EXPECT_EQ(a, nullptr);
    unowned_ptr<int> b { &i };
    a = b;
    EXPECT_EQ(a, &i);
    EXPECT_EQ(a, b);

}